

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O1

void __thiscall OpenMD::MAW::MAW(MAW *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction =
       (_func_int **)&PTR__MAW_003086d0;
  this->initialized_ = false;
  p_Var1 = &(this->MAWtypes)._M_t._M_impl.super__Rb_tree_header;
  (this->MAWtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MAWtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->MAWtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->MAWtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->MAWtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->forceField_ = (ForceField *)0x0;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->name_,"MAW","");
  return;
}

Assistant:

MAW::MAW() : initialized_(false), forceField_(NULL), name_("MAW") {}